

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

char mbedtls_ct_base64_dec_value(uchar c)

{
  return (~((byte)(c + 0xffd1 >> 8) | (byte)(0x2f - (uint)c >> 8)) & c + 0x11 |
         ~((byte)(c + 0xffd5 >> 8) | (byte)(0x2b - (uint)c >> 8)) & c + 0x14 |
         ~((byte)(c + 0xffd0 >> 8) | (byte)(0x39 - (uint)c >> 8)) & c + 5 |
         ~((byte)(c + 0xff9f >> 8) | (byte)(0x7a - (uint)c >> 8)) & c + 0xba |
         ~((byte)(c + 0xffbf >> 8) | (byte)(0x5a - (uint)c >> 8)) & c - 0x40) - 1;
}

Assistant:

MBEDTLS_STATIC_TESTABLE
signed char mbedtls_ct_base64_dec_value(unsigned char c)
{
    unsigned char val = 0;
    /* For each range of digits, if c is in that range, mask val with
     * the corresponding value. Since c can only be in a single range,
     * only at most one masking will change val. Set val to one plus
     * the desired value so that it stays 0 if c is in none of the ranges. */
    val |= mbedtls_ct_uchar_in_range_if('A', 'Z', c, c - 'A' +  0 + 1);
    val |= mbedtls_ct_uchar_in_range_if('a', 'z', c, c - 'a' + 26 + 1);
    val |= mbedtls_ct_uchar_in_range_if('0', '9', c, c - '0' + 52 + 1);
    val |= mbedtls_ct_uchar_in_range_if('+', '+', c, c - '+' + 62 + 1);
    val |= mbedtls_ct_uchar_in_range_if('/', '/', c, c - '/' + 63 + 1);
    /* At this point, val is 0 if c is an invalid digit and v+1 if c is
     * a digit with the value v. */
    return val - 1;
}